

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuid_tool.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  undefined1 local_7f8 [8];
  cpuid_data_t data;
  cpuid_raw_data_t raw;
  int ret;
  char **argv_local;
  int argc_local;
  
  memset(&icuid_opts,0,0x20);
  iVar2 = options_parse(argc,argv,icuid_options,(char **)0x0);
  if (iVar2 == 0) {
    if (icuid_opts.help == 0) {
      out = _stdout;
      if ((icuid_opts.out == (char *)0x0) ||
         (out = (FILE *)fopen(icuid_opts.out,"w"), (FILE *)out != (FILE *)0x0)) {
        if (icuid_opts.dump == (char *)0x0) {
          if (icuid_opts.data == (char *)0x0) {
            iVar2 = cpuid_get_raw_data((cpuid_raw_data_t *)&data.field_0x1c4);
            pFVar1 = out;
            if (iVar2 != 0) {
              pcVar3 = icuid_errorstr(iVar2);
              fprintf((FILE *)pFVar1,"%s\n",pcVar3);
              return -1;
            }
          }
          else {
            iVar2 = cpuid_serialize_raw_data((cpuid_raw_data_t *)&data.field_0x1c4,icuid_opts.data);
            pFVar1 = out;
            if (iVar2 != 0) {
              pcVar3 = icuid_errorstr(iVar2);
              fprintf((FILE *)pFVar1,"%s\n",pcVar3);
              return -1;
            }
          }
          argv_local._4_4_ =
               print_summary((cpuid_raw_data_t *)&data.field_0x1c4,(cpuid_data_t *)local_7f8);
          if (icuid_opts.out != (char *)0x0) {
            fclose((FILE *)out);
          }
        }
        else {
          iVar2 = cpuid_deserialize_raw_data((cpuid_raw_data_t *)&data.field_0x1c4,icuid_opts.dump);
          pFVar1 = out;
          if (iVar2 == 0) {
            argv_local._4_4_ = 0;
          }
          else {
            pcVar3 = icuid_errorstr(iVar2);
            fprintf((FILE *)pFVar1,"%s\n",pcVar3);
            argv_local._4_4_ = -1;
          }
        }
      }
      else {
        fprintf(_stderr,"Can\'t open file %s\n",icuid_opts.out);
        argv_local._4_4_ = -1;
      }
    }
    else {
      usage();
      argv_local._4_4_ = 0;
    }
  }
  else {
    usage();
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = -1;
    cpuid_raw_data_t raw;
    cpuid_data_t data;

    memset(&icuid_opts, 0, sizeof(icuid_opts));

    if (options_parse(argc, argv, icuid_options, NULL) != 0) {
        usage();
        return -1;
    }

    if (icuid_opts.help) {
        usage();
        return 0;
    }

    out = stdout;
    if (icuid_opts.out != NULL) {
        if ((out = fopen(icuid_opts.out, "w")) == NULL) {
            fprintf(stderr, "Can't open file %s\n", icuid_opts.out);
            return -1;
        }
    }

    if (icuid_opts.dump != NULL) {
        ret = cpuid_deserialize_raw_data(&raw, icuid_opts.dump);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
        return 0;
    }

    if (icuid_opts.data != NULL) {
        ret = cpuid_serialize_raw_data(&raw, icuid_opts.data);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
    } else {
        ret = cpuid_get_raw_data(&raw);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
    }

    ret = print_summary(&raw, &data);

    if (icuid_opts.out != NULL)
        fclose(out);

    return ret;
}